

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BuildSystem.cpp
# Opt level: O1

bool __thiscall
anon_unknown.dwarf_6d54c::SharedLibraryShellCommand::configureAttribute
          (SharedLibraryShellCommand *this,ConfigureContext *ctx,StringRef name,StringRef value)

{
  long *plVar1;
  StringRef Separator;
  SmallVector<llvm::StringRef,_32U> args;
  Child local_288;
  size_t sStack_280;
  Child local_278;
  pointer pbStack_270;
  pointer local_268;
  Child local_258;
  pointer pbStack_250;
  pointer local_248;
  Child local_240;
  ulong local_238;
  Child local_230 [64];
  
  plVar1 = (long *)name.Data;
  sStack_280 = value.Length;
  local_288 = (Child)value.Data;
  if (name.Length != 0xe) {
    if (name.Length != 10) {
      return true;
    }
    if ((short)plVar1[1] != 0x656c || *plVar1 != 0x6261747563657865) {
      if ((short)plVar1[1] != 0x7367 || *plVar1 != 0x72612d726568746f) {
        return true;
      }
      local_238 = 0x2000000000;
      Separator.Length = 1;
      Separator.Data = " ";
      local_278 = local_288;
      pbStack_270 = (pointer)sStack_280;
      local_240.twine = (Twine *)local_230;
      llvm::StringRef::split
                ((StringRef *)&local_278,(SmallVectorImpl<llvm::StringRef> *)&local_240,Separator,-1
                 ,false);
      local_258.twine = (Twine *)0x0;
      pbStack_250 = (pointer)0x0;
      local_248 = (pointer)0x0;
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      _M_range_initialize<llvm::StringRef*>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_258,
                 local_240.twine,&(local_240.twine)->LHS + (local_238 & 0xffffffff) * 2);
      local_278 = (Child)(this->otherArgs).
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start;
      pbStack_270 = (this->otherArgs).
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish;
      local_268 = (this->otherArgs).
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage;
      (this->otherArgs).
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)local_258;
      (this->otherArgs).
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = pbStack_250;
      (this->otherArgs).
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = local_248;
      local_258.twine = (Twine *)0x0;
      pbStack_250 = (pointer)0x0;
      local_248 = (pointer)0x0;
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&local_278);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&local_258);
      if (local_240.twine == (Twine *)local_230) {
        return true;
      }
      free(local_240.twine);
      return true;
    }
    local_240.twine = (Twine *)local_230;
    if (local_288.twine == (Twine *)0x0) {
      local_238 = 0;
      local_230[0].character = '\0';
    }
    else {
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_240,local_288.twine,
                 (char *)((long)&(local_288.twine)->LHS + sStack_280));
    }
    std::__cxx11::string::operator=((string *)&this->executable,(string *)&local_240.character);
    if (local_240.twine == (Twine *)local_230) {
      return true;
    }
    goto LAB_00120b63;
  }
  if (*(long *)((long)plVar1 + 6) != 0x656c7974732d7265 || *plVar1 != 0x72656c69706d6f63) {
    return true;
  }
  if (sStack_280 == 6) {
    if (*(short *)((long)&(local_288.twine)->LHS + 4) != 0x6374 ||
        ((local_288.twine)->LHS).decUI != 0x66697773) goto LAB_00120a6f;
  }
  else if (sStack_280 == 5) {
    if (*(char *)((long)&(local_288.twine)->LHS + 4) != 'g' ||
        ((local_288.twine)->LHS).decUI != 0x6e616c63) goto LAB_00120a6f;
  }
  else if ((sStack_280 != 2) || (*(short *)&(local_288.twine)->LHS != 0x6c63)) {
LAB_00120a6f:
    llvm::Twine::Twine((Twine *)&local_278,"Unsupported : compiler-style\'",(StringRef *)&local_288)
    ;
    llvm::Twine::Twine((Twine *)&local_258,
                       "\' for shared libraries\'.  Supported styles are cl, clang, and swiftc");
    llvm::operator+((Twine *)&local_240,(Twine *)&local_278,(Twine *)&local_258);
    llbuild::buildsystem::ConfigureContext::error(ctx,(Twine *)&local_240);
  }
  local_240.twine = (Twine *)local_230;
  if (local_288.twine == (Twine *)0x0) {
    local_238 = 0;
    local_230[0].character = '\0';
  }
  else {
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_240,local_288.twine,
               (char *)((long)&(local_288.twine)->LHS + sStack_280));
  }
  std::__cxx11::string::operator=((string *)&this->compilerStyle,(string *)&local_240.character);
  if (&(local_240.twine)->LHS == local_230) {
    return true;
  }
LAB_00120b63:
  operator_delete(local_240.twine,CONCAT71(local_230[0]._1_7_,local_230[0].character) + 1);
  return true;
}

Assistant:

virtual bool configureAttribute(const ConfigureContext& ctx, StringRef name,
                                  StringRef value) override {
    if (name == "executable") {
      executable = value;
    } else if (name == "other-args") {
      SmallVector<StringRef, 32> args;
      StringRef(value).split(args, " ", /*MaxSplit=*/-1,
                             /*KeepEmpty=*/false);
      otherArgs = std::vector<std::string>(args.begin(), args.end());
    } else if (name == "compiler-style") {
      if (value != "cl" && value != "clang" && value != "swiftc") {
        ctx.error("Unsupported : compiler-style'" + value +
                  "' for shared libraries'.  Supported styles are cl, clang, "
                  "and swiftc");
      }
      compilerStyle = value;
    }
    return true;
  }